

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::EliminateDeadMembersPass::Process(EliminateDeadMembersPass *this)

{
  bool bVar1;
  IRContext *this_00;
  FeatureManager *this_01;
  EliminateDeadMembersPass *this_local;
  
  this_00 = Pass::context((Pass *)this);
  this_01 = IRContext::get_feature_mgr(this_00);
  bVar1 = FeatureManager::HasCapability(this_01,CapabilityShader);
  if (bVar1) {
    FindLiveMembers(this);
    bVar1 = RemoveDeadMembers(this);
    if (bVar1) {
      this_local._4_4_ = SuccessWithChange;
    }
    else {
      this_local._4_4_ = SuccessWithoutChange;
    }
  }
  else {
    this_local._4_4_ = SuccessWithoutChange;
  }
  return this_local._4_4_;
}

Assistant:

Pass::Status EliminateDeadMembersPass::Process() {
  if (!context()->get_feature_mgr()->HasCapability(spv::Capability::Shader))
    return Status::SuccessWithoutChange;

  FindLiveMembers();
  if (RemoveDeadMembers()) {
    return Status::SuccessWithChange;
  }
  return Status::SuccessWithoutChange;
}